

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

CaseGenerateSyntax * __thiscall
slang::parsing::Parser::parseCaseGenerateConstruct(Parser *this,AttrList attributes)

{
  SourceLocation noteLocation;
  Token colon_00;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token colon_01;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_00;
  span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL> elements_01;
  Token defaultKeyword;
  Token openParen_00;
  Token keyword_00;
  Token closeParen_00;
  Token endCase;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  StandardCaseItemSyntax *pSVar3;
  CaseGenerateSyntax *pCVar4;
  EVP_PKEY_CTX *src;
  undefined8 extraout_RDX;
  EVP_PKEY_CTX *src_00;
  Info *extraout_RDX_00;
  ParserBase *in_RDI;
  Token TVar5;
  Token TVar6;
  Token endcase;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  Token colon_1;
  Token colon;
  Token def;
  Diagnostic *diag;
  TokenKind kind;
  bool errored;
  SourceLocation lastDefault;
  SmallVector<slang::syntax::CaseItemSyntax_*,_5UL> itemBuffer;
  Token closeParen;
  ExpressionSyntax *condition;
  Token openParen;
  Token keyword;
  ParserBase *in_stack_fffffffffffffb08;
  undefined4 uVar7;
  Parser *in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  undefined4 in_stack_fffffffffffffb20;
  DiagCode in_stack_fffffffffffffb24;
  undefined8 in_stack_fffffffffffffb28;
  ParserBase *in_stack_fffffffffffffb30;
  undefined8 in_stack_fffffffffffffb38;
  Info *in_stack_fffffffffffffb40;
  ExpressionSyntax *pEVar8;
  Info *pIVar9;
  ParserBase *condition_00;
  ParserBase *in_stack_fffffffffffffb70;
  SourceLocation in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb80;
  DiagCode in_stack_fffffffffffffb84;
  MemberSyntax *in_stack_fffffffffffffb88;
  undefined8 in_stack_fffffffffffffb98;
  TokenKind kind_00;
  ParserBase *in_stack_fffffffffffffba0;
  pointer in_stack_fffffffffffffc20;
  undefined7 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2f;
  undefined8 in_stack_fffffffffffffc50;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_2d8;
  Info *pIStack_2d0;
  Parser *in_stack_fffffffffffffd58;
  undefined1 local_250 [248];
  Token local_158;
  Token local_148;
  DefaultCaseItemSyntax *local_130;
  Token local_128;
  Token local_118;
  Token local_108;
  SourceLocation local_f8;
  SourceLocation local_f0;
  undefined4 local_e4;
  pointer local_e0;
  Info *local_d8;
  SourceLocation local_d0;
  undefined4 local_c4;
  Diagnostic *local_c0;
  Token local_b8;
  TokenKind local_a8;
  byte local_a5;
  SourceLocation local_98;
  SmallVectorBase<slang::syntax::CaseItemSyntax_*> local_90 [2];
  Token local_50;
  ExpressionSyntax *local_40;
  Token local_38;
  Token local_28 [2];
  
  local_28[0] = ParserBase::consume(in_stack_fffffffffffffb30);
  local_38 = ParserBase::expect(in_stack_fffffffffffffba0,
                                (TokenKind)((ulong)in_stack_fffffffffffffb98 >> 0x30));
  local_40 = parseExpression(in_stack_fffffffffffffb10);
  local_50 = ParserBase::expect(in_stack_fffffffffffffba0,
                                (TokenKind)((ulong)in_stack_fffffffffffffb98 >> 0x30));
  SmallVector<slang::syntax::CaseItemSyntax_*,_5UL>::SmallVector
            ((SmallVector<slang::syntax::CaseItemSyntax_*,_5UL> *)0xa3855a);
  SourceLocation::SourceLocation(&local_98);
  local_a5 = 0;
  while( true ) {
    while( true ) {
      TVar5 = ParserBase::peek(in_stack_fffffffffffffb08);
      kind_00 = (TokenKind)((ulong)in_stack_fffffffffffffb98 >> 0x30);
      local_b8.kind = TVar5.kind;
      local_a8 = local_b8.kind;
      local_b8 = TVar5;
      if (local_b8.kind != DefaultKeyword) break;
      in_stack_fffffffffffffc2f = SourceLocation::operator_cast_to_bool((SourceLocation *)0xa385df);
      if (((bool)in_stack_fffffffffffffc2f) && ((local_a5 & 1) == 0)) {
        local_c4 = 0x810005;
        TVar5 = ParserBase::peek(in_stack_fffffffffffffb08);
        local_d8 = TVar5.info;
        in_stack_fffffffffffffc20 = TVar5._0_8_;
        local_e0 = in_stack_fffffffffffffc20;
        local_d0 = Token::location((Token *)&local_e0);
        local_c0 = ParserBase::addDiag(in_stack_fffffffffffffb70,in_stack_fffffffffffffb84,
                                       in_stack_fffffffffffffb78);
        local_e4 = 0xa0001;
        local_f0 = local_98;
        noteLocation._4_4_ = in_stack_fffffffffffffb1c;
        noteLocation._0_4_ = in_stack_fffffffffffffb18;
        Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb24,
                            noteLocation);
        local_a5 = 1;
      }
      TVar5 = ParserBase::peek(in_stack_fffffffffffffb08);
      local_108 = TVar5;
      local_f8 = Token::location(&local_108);
      local_98 = local_f8;
      TVar5 = ParserBase::consume(in_stack_fffffffffffffb30);
      local_118 = TVar5;
      TVar5 = ParserBase::consumeIf
                        (&in_stack_fffffffffffffb10->super_ParserBase,
                         (TokenKind)((ulong)in_stack_fffffffffffffb08 >> 0x30));
      local_158 = TVar5;
      local_128 = TVar5;
      local_148 = local_118;
      parseGenerateBlock(in_stack_fffffffffffffd58);
      defaultKeyword.info = (Info *)in_stack_fffffffffffffb30;
      defaultKeyword.kind = (short)in_stack_fffffffffffffb28;
      defaultKeyword._2_1_ = (char)((ulong)in_stack_fffffffffffffb28 >> 0x10);
      defaultKeyword.numFlags.raw = (char)((ulong)in_stack_fffffffffffffb28 >> 0x18);
      defaultKeyword.rawLen = (int)((ulong)in_stack_fffffffffffffb28 >> 0x20);
      colon_00.rawLen = in_stack_fffffffffffffb1c;
      colon_00.kind = (short)in_stack_fffffffffffffb18;
      colon_00._2_1_ = (char)((uint)in_stack_fffffffffffffb18 >> 0x10);
      colon_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffb18 >> 0x18);
      colon_00.info._0_4_ = in_stack_fffffffffffffb20;
      colon_00.info._4_4_ = in_stack_fffffffffffffb24;
      local_130 = slang::syntax::SyntaxFactory::defaultCaseItem
                            ((SyntaxFactory *)in_stack_fffffffffffffb10,defaultKeyword,colon_00,
                             (SyntaxNode *)in_stack_fffffffffffffb08);
      SmallVectorBase<slang::syntax::CaseItemSyntax_*>::push_back
                ((SmallVectorBase<slang::syntax::CaseItemSyntax_*> *)in_stack_fffffffffffffb10,
                 (CaseItemSyntax **)in_stack_fffffffffffffb08);
    }
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpression
                      ((TokenKind)((ulong)in_stack_fffffffffffffb10 >> 0x20));
    uVar7 = (undefined4)((ulong)in_stack_fffffffffffffb08 >> 0x20);
    if (!bVar1) break;
    Token::Token((Token *)in_stack_fffffffffffffb10);
    SmallVector<slang::syntax::TokenOrSyntax,_8UL>::SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0xa388ff);
    local_250._12_4_ = 0x10001;
    in_stack_fffffffffffffb10 = (Parser *)local_250;
    in_stack_fffffffffffffb08 = (ParserBase *)CONCAT44(uVar7,0x10001);
    in_stack_fffffffffffffb18 = 0;
    ParserBase::
    parseList<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfCaseItem,slang::parsing::Parser::parseCaseGenerateConstruct(std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>)::__0>
              (in_RDI,TVar5._0_8_,TVar5.info._6_2_,TVar5.info._4_2_,
               (Token *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
               (RequireItems)((ulong)in_stack_fffffffffffffc20 >> 0x20),
               SUB84(in_stack_fffffffffffffc50,0),in_stack_fffffffffffffc58,
               (AllowEmpty)in_stack_fffffffffffffc60);
    iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)(local_250 + 0x10),
                       (EVP_PKEY_CTX *)in_RDI->alloc,src);
    in_stack_fffffffffffffba0 = (ParserBase *)CONCAT44(extraout_var,iVar2);
    elements._M_ptr._4_4_ = in_stack_fffffffffffffb1c;
    elements._M_ptr._0_4_ = in_stack_fffffffffffffb18;
    elements._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffb20;
    elements._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffb24;
    in_stack_fffffffffffffb98 = extraout_RDX;
    slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::SeparatedSyntaxList
              ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)in_stack_fffffffffffffb10,
               elements);
    in_stack_fffffffffffffb88 = parseGenerateBlock(in_stack_fffffffffffffd58);
    colon_01.rawLen = in_stack_fffffffffffffb1c;
    colon_01.kind = (short)in_stack_fffffffffffffb18;
    colon_01._2_1_ = (char)((uint)in_stack_fffffffffffffb18 >> 0x10);
    colon_01.numFlags.raw = (char)((uint)in_stack_fffffffffffffb18 >> 0x18);
    colon_01.info._0_4_ = in_stack_fffffffffffffb20;
    colon_01.info._4_4_ = in_stack_fffffffffffffb24;
    pSVar3 = slang::syntax::SyntaxFactory::standardCaseItem
                       ((SyntaxFactory *)in_stack_fffffffffffffb10,
                        (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
                        in_stack_fffffffffffffb08,colon_01,(SyntaxNode *)0xa38a2f);
    in_stack_fffffffffffffb80 = SUB84(pSVar3,0);
    in_stack_fffffffffffffb84 = SUB84((ulong)pSVar3 >> 0x20,0);
    SmallVectorBase<slang::syntax::CaseItemSyntax_*>::push_back
              ((SmallVectorBase<slang::syntax::CaseItemSyntax_*> *)in_stack_fffffffffffffb10,
               (CaseItemSyntax **)in_stack_fffffffffffffb08);
    SmallVector<slang::syntax::TokenOrSyntax,_8UL>::~SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0xa38a67);
  }
  bVar1 = SmallVectorBase<slang::syntax::CaseItemSyntax_*>::empty(local_90);
  if (bVar1) {
    in_stack_fffffffffffffb78 = Token::location(local_28);
    ParserBase::addDiag(in_stack_fffffffffffffb70,in_stack_fffffffffffffb84,
                        in_stack_fffffffffffffb78);
  }
  TVar6 = ParserBase::expect(in_stack_fffffffffffffba0,kind_00);
  condition_00 = in_RDI + 1;
  elements_00._M_ptr._4_4_ = in_stack_fffffffffffffb1c;
  elements_00._M_ptr._0_4_ = in_stack_fffffffffffffb18;
  elements_00._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffb20;
  elements_00._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffb24;
  TVar5 = TVar6;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffb10,
             elements_00);
  pEVar8 = local_40;
  SmallVectorBase<slang::syntax::CaseItemSyntax_*>::copy
            (local_90,(EVP_PKEY_CTX *)in_RDI->alloc,src_00);
  elements_01._M_ptr._4_4_ = in_stack_fffffffffffffb1c;
  elements_01._M_ptr._0_4_ = in_stack_fffffffffffffb18;
  elements_01._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffb20;
  elements_01._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffb24;
  pIVar9 = extraout_RDX_00;
  slang::syntax::SyntaxList<slang::syntax::CaseItemSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::CaseItemSyntax> *)in_stack_fffffffffffffb10,elements_01);
  pIStack_2d0 = TVar6.info;
  local_2d8 = TVar6._0_8_;
  keyword_00.info = pIVar9;
  keyword_00._0_8_ = pEVar8;
  openParen_00.info = in_stack_fffffffffffffb40;
  openParen_00.kind = (short)in_stack_fffffffffffffb38;
  openParen_00._2_1_ = (char)((ulong)in_stack_fffffffffffffb38 >> 0x10);
  openParen_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffb38 >> 0x18);
  openParen_00.rawLen = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
  closeParen_00.info = TVar5._0_8_;
  closeParen_00._0_8_ = TVar5.info;
  endCase.rawLen._0_2_ = in_stack_fffffffffffffb84.subsystem;
  endCase.rawLen._2_2_ = in_stack_fffffffffffffb84.code;
  endCase.kind = (short)in_stack_fffffffffffffb80;
  endCase._2_1_ = (char)((uint)in_stack_fffffffffffffb80 >> 0x10);
  endCase.numFlags.raw = (char)((uint)in_stack_fffffffffffffb80 >> 0x18);
  endCase.info = (Info *)in_stack_fffffffffffffb88;
  pCVar4 = slang::syntax::SyntaxFactory::caseGenerate
                     ((SyntaxFactory *)pIStack_2d0,local_2d8,keyword_00,openParen_00,
                      (ExpressionSyntax *)condition_00,closeParen_00,
                      (SyntaxList<slang::syntax::CaseItemSyntax> *)in_stack_fffffffffffffb78,endCase
                     );
  SmallVector<slang::syntax::CaseItemSyntax_*,_5UL>::~SmallVector
            ((SmallVector<slang::syntax::CaseItemSyntax_*,_5UL> *)0xa38c90);
  return pCVar4;
}

Assistant:

CaseGenerateSyntax& Parser::parseCaseGenerateConstruct(AttrList attributes) {
    auto keyword = consume();
    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& condition = parseExpression();
    auto closeParen = expect(TokenKind::CloseParenthesis);

    SmallVector<CaseItemSyntax*> itemBuffer;
    SourceLocation lastDefault;
    bool errored = false;

    while (true) {
        auto kind = peek().kind;
        if (kind == TokenKind::DefaultKeyword) {
            if (lastDefault && !errored) {
                auto& diag = addDiag(diag::MultipleGenerateDefaultCases, peek().location());
                diag.addNote(diag::NotePreviousDefinition, lastDefault);
                errored = true;
            }

            lastDefault = peek().location();

            auto def = consume();
            auto colon = consumeIf(TokenKind::Colon);
            itemBuffer.push_back(&factory.defaultCaseItem(def, colon, parseGenerateBlock()));
        }
        else if (isPossibleExpression(kind)) {
            Token colon;
            SmallVector<TokenOrSyntax, 8> buffer;
            parseList<isPossibleExpressionOrComma, isEndOfCaseItem>(
                buffer, TokenKind::Colon, TokenKind::Comma, colon, RequireItems::True,
                diag::ExpectedExpression, [this] { return &parseExpression(); });
            itemBuffer.push_back(
                &factory.standardCaseItem(buffer.copy(alloc), colon, parseGenerateBlock()));
        }
        else {
            break;
        }
    }

    if (itemBuffer.empty())
        addDiag(diag::CaseGenerateEmpty, keyword.location());

    auto endcase = expect(TokenKind::EndCaseKeyword);
    return factory.caseGenerate(attributes, keyword, openParen, condition, closeParen,
                                itemBuffer.copy(alloc), endcase);
}